

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O0

bool __thiscall
cmFileCommand::HandleGlobCommand
          (cmFileCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,bool recurse)

{
  cmMakefile *pcVar1;
  bool bVar2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar3;
  bool bVar4;
  uint uVar5;
  size_type sVar6;
  reference pbVar7;
  ulong uVar8;
  pointer pMVar9;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar10;
  reference pvVar11;
  char *pcVar12;
  PolicyID id;
  string local_350;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_330;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *files;
  size_type cc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_300;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_280;
  __normal_iterator<cmsys::Glob::Message_*,_std::vector<cmsys::Glob::Message,_std::allocator<cmsys::Glob::Message>_>_>
  local_260;
  __normal_iterator<cmsys::Glob::Message_*,_std::vector<cmsys::Glob::Message,_std::allocator<cmsys::Glob::Message>_>_>
  local_258;
  GlobMessagesIterator it;
  undefined1 local_248 [7];
  bool shouldExit;
  allocator local_221;
  undefined1 local_220 [8];
  string expr;
  GlobMessages globMessages;
  string local_1e0;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1c0;
  allocator local_1b1;
  string local_1b0;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_190;
  allocator local_181;
  string local_180;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_160;
  allocator local_151;
  string local_150;
  int local_130;
  allocator local_129;
  string local_128;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_108;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_100;
  byte local_f2;
  allocator local_f1;
  string local_f0 [6];
  bool first;
  string output;
  PolicyStatus status;
  bool explicitFollowSymlinks;
  undefined1 local_b8 [8];
  Glob g;
  undefined1 local_58 [8];
  string variable;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_30;
  const_iterator i;
  bool recurse_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  cmFileCommand *this_local;
  
  i._M_current._7_1_ = recurse;
  sVar6 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(args);
  if (sVar6 < 2) {
    __assert_fail("args.size() > 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/cmFileCommand.cxx"
                  ,0x37c,
                  "bool cmFileCommand::HandleGlobCommand(const std::vector<std::string> &, bool)");
  }
  local_30._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin(args);
  variable.field_2._8_8_ =
       __gnu_cxx::
       __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::operator++(&local_30,0);
  pbVar7 = __gnu_cxx::
           __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator*(&local_30);
  std::__cxx11::string::string((string *)local_58,(string *)pbVar7);
  g._80_8_ = __gnu_cxx::
             __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator++(&local_30,0);
  cmsys::Glob::Glob((Glob *)local_b8);
  cmsys::Glob::SetRecurse((Glob *)local_b8,(bool)(i._M_current._7_1_ & 1));
  bVar2 = false;
  output.field_2._12_4_ = cmMakefile::GetPolicyStatus((this->super_cmCommand).Makefile,CMP0009);
  if ((i._M_current._7_1_ & 1) != 0) {
    if ((uint)output.field_2._12_4_ < NEW) {
      cmsys::Glob::RecurseThroughSymlinksOn((Glob *)local_b8);
    }
    else if (output.field_2._12_4_ - NEW < 3) {
      cmsys::Glob::RecurseThroughSymlinksOff((Glob *)local_b8);
    }
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_f0,"",&local_f1);
  std::allocator<char>::~allocator((allocator<char> *)&local_f1);
  local_f2 = 1;
  do {
    local_100._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end(args);
    bVar4 = __gnu_cxx::operator!=(&local_30,&local_100);
    if (!bVar4) {
      if (((((i._M_current._7_1_ & 1) != 0) && (!bVar2)) && ((uint)output.field_2._12_4_ < 2)) &&
         (uVar5 = cmsys::Glob::GetFollowedSymlinkCount((Glob *)local_b8), uVar5 != 0)) {
        pcVar1 = (this->super_cmCommand).Makefile;
        cmPolicies::GetPolicyWarning_abi_cxx11_(&local_350,(cmPolicies *)0x9,id);
        cmMakefile::IssueMessage(pcVar1,AUTHOR_WARNING,&local_350,false);
        std::__cxx11::string::~string((string *)&local_350);
      }
      pcVar1 = (this->super_cmCommand).Makefile;
      pcVar12 = (char *)std::__cxx11::string::c_str();
      cmMakefile::AddDefinition(pcVar1,(string *)local_58,pcVar12);
      this_local._7_1_ = 1;
      local_130 = 1;
LAB_0071222b:
      std::__cxx11::string::~string(local_f0);
      cmsys::Glob::~Glob((Glob *)local_b8);
      std::__cxx11::string::~string((string *)local_58);
      return (bool)(this_local._7_1_ & 1);
    }
    pbVar7 = __gnu_cxx::
             __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&local_30);
    bVar4 = std::operator==(pbVar7,"LIST_DIRECTORIES");
    if (bVar4) {
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&local_30);
      local_108._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end(args);
      bVar4 = __gnu_cxx::operator!=(&local_30,&local_108);
      if (!bVar4) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_150,"LIST_DIRECTORIES missing bool value.",&local_151);
        cmCommand::SetError(&this->super_cmCommand,&local_150);
        std::__cxx11::string::~string((string *)&local_150);
        std::allocator<char>::~allocator((allocator<char> *)&local_151);
        this_local._7_1_ = 0;
        local_130 = 1;
        goto LAB_0071222b;
      }
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator->(&local_30);
      pcVar12 = (char *)std::__cxx11::string::c_str();
      bVar4 = cmSystemTools::IsOn(pcVar12);
      if (bVar4) {
        cmsys::Glob::SetListDirs((Glob *)local_b8,true);
        cmsys::Glob::SetRecurseListDirs((Glob *)local_b8,true);
      }
      else {
        __gnu_cxx::
        __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator->(&local_30);
        pcVar12 = (char *)std::__cxx11::string::c_str();
        bVar4 = cmSystemTools::IsOff(pcVar12);
        if (!bVar4) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)&local_128,"LIST_DIRECTORIES missing bool value.",&local_129);
          cmCommand::SetError(&this->super_cmCommand,&local_128);
          std::__cxx11::string::~string((string *)&local_128);
          std::allocator<char>::~allocator((allocator<char> *)&local_129);
          this_local._7_1_ = 0;
          local_130 = 1;
          goto LAB_0071222b;
        }
        cmsys::Glob::SetListDirs((Glob *)local_b8,false);
        cmsys::Glob::SetRecurseListDirs((Glob *)local_b8,false);
      }
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&local_30);
    }
    if ((i._M_current._7_1_ & 1) != 0) {
      pbVar7 = __gnu_cxx::
               __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&local_30);
      bVar4 = std::operator==(pbVar7,"FOLLOW_SYMLINKS");
      if (bVar4) {
        bVar2 = true;
        cmsys::Glob::RecurseThroughSymlinksOn((Glob *)local_b8);
        __gnu_cxx::
        __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&local_30);
        local_160._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end(args);
        bVar4 = __gnu_cxx::operator==(&local_30,&local_160);
        if (bVar4) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)&local_180,
                     "GLOB_RECURSE requires a glob expression after FOLLOW_SYMLINKS",&local_181);
          cmCommand::SetError(&this->super_cmCommand,&local_180);
          std::__cxx11::string::~string((string *)&local_180);
          std::allocator<char>::~allocator((allocator<char> *)&local_181);
          this_local._7_1_ = 0;
          local_130 = 1;
          goto LAB_0071222b;
        }
      }
    }
    pbVar7 = __gnu_cxx::
             __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&local_30);
    bVar4 = std::operator==(pbVar7,"RELATIVE");
    if (bVar4) {
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&local_30);
      local_190._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end(args);
      bVar4 = __gnu_cxx::operator==(&local_30,&local_190);
      if (bVar4) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_1b0,"GLOB requires a directory after the RELATIVE tag",
                   &local_1b1);
        cmCommand::SetError(&this->super_cmCommand,&local_1b0);
        std::__cxx11::string::~string((string *)&local_1b0);
        std::allocator<char>::~allocator((allocator<char> *)&local_1b1);
        this_local._7_1_ = 0;
        local_130 = 1;
        goto LAB_0071222b;
      }
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator->(&local_30);
      pcVar12 = (char *)std::__cxx11::string::c_str();
      cmsys::Glob::SetRelative((Glob *)local_b8,pcVar12);
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&local_30);
      local_1c0._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end(args);
      bVar4 = __gnu_cxx::operator==(&local_30,&local_1c0);
      if (bVar4) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_1e0,"GLOB requires a glob expression after the directory",
                   (allocator *)
                   ((long)&globMessages.
                           super__Vector_base<cmsys::Glob::Message,_std::allocator<cmsys::Glob::Message>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
        cmCommand::SetError(&this->super_cmCommand,&local_1e0);
        std::__cxx11::string::~string((string *)&local_1e0);
        std::allocator<char>::~allocator
                  ((allocator<char> *)
                   ((long)&globMessages.
                           super__Vector_base<cmsys::Glob::Message,_std::allocator<cmsys::Glob::Message>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
        this_local._7_1_ = 0;
        local_130 = 1;
        goto LAB_0071222b;
      }
    }
    std::vector<cmsys::Glob::Message,_std::allocator<cmsys::Glob::Message>_>::vector
              ((vector<cmsys::Glob::Message,_std::allocator<cmsys::Glob::Message>_> *)
               ((long)&expr.field_2 + 8));
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator->(&local_30);
    pcVar12 = (char *)std::__cxx11::string::c_str();
    bVar4 = cmsys::SystemTools::FileIsFullPath(pcVar12);
    if (bVar4) {
      pbVar7 = __gnu_cxx::
               __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&local_30);
      cmsys::Glob::FindFiles((Glob *)local_b8,pbVar7,(GlobMessages *)((long)&expr.field_2 + 8));
    }
    else {
      pcVar12 = cmMakefile::GetCurrentSourceDirectory((this->super_cmCommand).Makefile);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)local_220,pcVar12,&local_221);
      std::allocator<char>::~allocator((allocator<char> *)&local_221);
      uVar8 = std::__cxx11::string::empty();
      if ((uVar8 & 1) == 0) {
        pbVar7 = __gnu_cxx::
                 __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&local_30);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_248,"/",pbVar7);
        std::__cxx11::string::operator+=((string *)local_220,(string *)local_248);
        std::__cxx11::string::~string((string *)local_248);
        cmsys::Glob::FindFiles
                  ((Glob *)local_b8,(string *)local_220,(GlobMessages *)((long)&expr.field_2 + 8));
      }
      else {
        pbVar7 = __gnu_cxx::
                 __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&local_30);
        cmsys::Glob::FindFiles((Glob *)local_b8,pbVar7,(GlobMessages *)((long)&expr.field_2 + 8));
      }
      std::__cxx11::string::~string((string *)local_220);
    }
    bVar4 = std::vector<cmsys::Glob::Message,_std::allocator<cmsys::Glob::Message>_>::empty
                      ((vector<cmsys::Glob::Message,_std::allocator<cmsys::Glob::Message>_> *)
                       ((long)&expr.field_2 + 8));
    if (bVar4) {
LAB_00712018:
      local_330 = cmsys::Glob::GetFiles_abi_cxx11_((Glob *)local_b8);
      for (files = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)0x0; pvVar3 = files,
          pvVar10 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::size(local_330), pvVar3 < pvVar10;
          files = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)((long)&(files->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start + 1)) {
        if ((local_f2 & 1) == 0) {
          std::__cxx11::string::operator+=(local_f0,";");
        }
        pvVar11 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::operator[](local_330,(size_type)files);
        std::__cxx11::string::operator+=(local_f0,(string *)pvVar11);
        local_f2 = 0;
      }
      local_130 = 0;
    }
    else {
      it._M_current._7_1_ = 0;
      local_258._M_current =
           (Message *)
           std::vector<cmsys::Glob::Message,_std::allocator<cmsys::Glob::Message>_>::begin
                     ((vector<cmsys::Glob::Message,_std::allocator<cmsys::Glob::Message>_> *)
                      ((long)&expr.field_2 + 8));
      while( true ) {
        local_260._M_current =
             (Message *)
             std::vector<cmsys::Glob::Message,_std::allocator<cmsys::Glob::Message>_>::end
                       ((vector<cmsys::Glob::Message,_std::allocator<cmsys::Glob::Message>_> *)
                        ((long)&expr.field_2 + 8));
        bVar4 = __gnu_cxx::operator!=(&local_258,&local_260);
        if (!bVar4) break;
        pMVar9 = __gnu_cxx::
                 __normal_iterator<cmsys::Glob::Message_*,_std::vector<cmsys::Glob::Message,_std::allocator<cmsys::Glob::Message>_>_>
                 ::operator->(&local_258);
        if (pMVar9->type == cyclicRecursion) {
          pcVar1 = (this->super_cmCommand).Makefile;
          pbVar7 = __gnu_cxx::
                   __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator*(&local_30);
          std::operator+(&local_2c0,"Cyclic recursion detected while globbing for \'",pbVar7);
          std::operator+(&local_2a0,&local_2c0,"\':\n");
          pMVar9 = __gnu_cxx::
                   __normal_iterator<cmsys::Glob::Message_*,_std::vector<cmsys::Glob::Message,_std::allocator<cmsys::Glob::Message>_>_>
                   ::operator->(&local_258);
          std::operator+(&local_280,&local_2a0,&pMVar9->content);
          cmMakefile::IssueMessage(pcVar1,AUTHOR_WARNING,&local_280,false);
          std::__cxx11::string::~string((string *)&local_280);
          std::__cxx11::string::~string((string *)&local_2a0);
          std::__cxx11::string::~string((string *)&local_2c0);
        }
        else {
          pcVar1 = (this->super_cmCommand).Makefile;
          pbVar7 = __gnu_cxx::
                   __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator*(&local_30);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&cc,
                         "Error has occured while globbing for \'",pbVar7);
          std::operator+(&local_300,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&cc,
                         "\' - ");
          pMVar9 = __gnu_cxx::
                   __normal_iterator<cmsys::Glob::Message_*,_std::vector<cmsys::Glob::Message,_std::allocator<cmsys::Glob::Message>_>_>
                   ::operator->(&local_258);
          std::operator+(&local_2e0,&local_300,&pMVar9->content);
          cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_2e0,false);
          std::__cxx11::string::~string((string *)&local_2e0);
          std::__cxx11::string::~string((string *)&local_300);
          std::__cxx11::string::~string((string *)&cc);
          it._M_current._7_1_ = 1;
        }
        __gnu_cxx::
        __normal_iterator<cmsys::Glob::Message_*,_std::vector<cmsys::Glob::Message,_std::allocator<cmsys::Glob::Message>_>_>
        ::operator++(&local_258);
      }
      if ((it._M_current._7_1_ & 1) == 0) goto LAB_00712018;
      this_local._7_1_ = 0;
      local_130 = 1;
    }
    std::vector<cmsys::Glob::Message,_std::allocator<cmsys::Glob::Message>_>::~vector
              ((vector<cmsys::Glob::Message,_std::allocator<cmsys::Glob::Message>_> *)
               ((long)&expr.field_2 + 8));
    if (local_130 != 0) goto LAB_0071222b;
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&local_30);
  } while( true );
}

Assistant:

bool cmFileCommand::HandleGlobCommand(std::vector<std::string> const& args,
  bool recurse)
{
  // File commands has at least one argument
  assert(args.size() > 1);

  std::vector<std::string>::const_iterator i = args.begin();

  i++; // Get rid of subcommand

  std::string variable = *i;
  i++;
  cmsys::Glob g;
  g.SetRecurse(recurse);

  bool explicitFollowSymlinks = false;
  cmPolicies::PolicyStatus status =
    this->Makefile->GetPolicyStatus(cmPolicies::CMP0009);
  if(recurse)
    {
    switch(status)
      {
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::REQUIRED_ALWAYS:
      case cmPolicies::NEW:
        g.RecurseThroughSymlinksOff();
        break;
      case cmPolicies::OLD:
      case cmPolicies::WARN:
        g.RecurseThroughSymlinksOn();
        break;
      }
    }

  std::string output = "";
  bool first = true;
  for ( ; i != args.end(); ++i )
    {
    if( *i == "LIST_DIRECTORIES" )
      {
      ++i;
      if(i != args.end())
        {
        if(cmSystemTools::IsOn(i->c_str()))
          {
          g.SetListDirs(true);
          g.SetRecurseListDirs(true);
          }
        else if(cmSystemTools::IsOff(i->c_str()))
          {
          g.SetListDirs(false);
          g.SetRecurseListDirs(false);
          }
        else
          {
          this->SetError("LIST_DIRECTORIES missing bool value.");
          return false;
          }
        }
      else
        {
        this->SetError("LIST_DIRECTORIES missing bool value.");
        return false;
        }
      ++i;
      }

    if ( recurse && (*i == "FOLLOW_SYMLINKS") )
      {
      explicitFollowSymlinks = true;
      g.RecurseThroughSymlinksOn();
      ++i;
      if ( i == args.end() )
        {
        this->SetError(
          "GLOB_RECURSE requires a glob expression after FOLLOW_SYMLINKS");
        return false;
        }
      }

    if ( *i == "RELATIVE" )
      {
      ++i; // skip RELATIVE
      if ( i == args.end() )
        {
        this->SetError("GLOB requires a directory after the RELATIVE tag");
        return false;
        }
      g.SetRelative(i->c_str());
      ++i;
      if(i == args.end())
        {
        this->SetError("GLOB requires a glob expression after the directory");
        return false;
        }
      }

    cmsys::Glob::GlobMessages globMessages;
    if ( !cmsys::SystemTools::FileIsFullPath(i->c_str()) )
      {
      std::string expr = this->Makefile->GetCurrentSourceDirectory();
      // Handle script mode
      if (!expr.empty())
        {
        expr += "/" + *i;
        g.FindFiles(expr, &globMessages);
        }
      else
        {
        g.FindFiles(*i, &globMessages);
        }
      }
    else
      {
      g.FindFiles(*i, &globMessages);
      }

    if(!globMessages.empty())
      {
      bool shouldExit = false;
      for(cmsys::Glob::GlobMessagesIterator it=globMessages.begin();
        it != globMessages.end(); ++it)
        {
        if(it->type == cmsys::Glob::cyclicRecursion)
          {
          this->Makefile->IssueMessage(cmake::AUTHOR_WARNING,
            "Cyclic recursion detected while globbing for '"
            + *i + "':\n" + it->content);
          }
        else
          {
          this->Makefile->IssueMessage(cmake::FATAL_ERROR,
            "Error has occured while globbing for '"
            + *i + "' - " + it->content);
          shouldExit = true;
          }
        }
      if(shouldExit)
        {
          return false;
        }
      }

    std::vector<std::string>::size_type cc;
    std::vector<std::string>& files = g.GetFiles();
    for ( cc = 0; cc < files.size(); cc ++ )
      {
      if ( !first )
        {
        output += ";";
        }
      output += files[cc];
      first = false;
      }
    }

  if(recurse && !explicitFollowSymlinks)
    {
    switch (status)
      {
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::REQUIRED_ALWAYS:
      case cmPolicies::NEW:
        // Correct behavior, yay!
        break;
      case cmPolicies::OLD:
        // Probably not really the expected behavior, but the author explicitly
        // asked for the old behavior... no warning.
      case cmPolicies::WARN:
        // Possibly unexpected old behavior *and* we actually traversed
        // symlinks without being explicitly asked to: warn the author.
        if(g.GetFollowedSymlinkCount() != 0)
          {
          this->Makefile->IssueMessage(cmake::AUTHOR_WARNING,
            cmPolicies::GetPolicyWarning(cmPolicies::CMP0009));
          }
        break;
      }
    }

  this->Makefile->AddDefinition(variable, output.c_str());
  return true;
}